

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O1

Expression * __thiscall
soul::StructuralParser::createBinaryOperator
          (StructuralParser *this,Context *c,Expression *a,Expression *b,Op op)

{
  PoolItem *pPVar1;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  if ((a->kind & ~unknown) != value) {
    CompileMessageHelpers::createMessage<>(&local_68,syntax,error,"Expected a value or endpoint");
    AST::Context::throwError(&(a->super_Statement).super_ASTObject.context,&local_68,false);
  }
  if ((b->kind & ~unknown) == value) {
    pPVar1 = PoolAllocator::allocateSpaceForObject(&this->allocator->pool,0x78);
    AST::BinaryOperator::BinaryOperator((BinaryOperator *)&pPVar1->item,c,a,b,op);
    pPVar1->destructor =
         PoolAllocator::
         allocate<soul::AST::BinaryOperator,_const_soul::AST::Context_&,_soul::AST::Expression_&,_soul::AST::Expression_&,_soul::BinaryOp::Op_&>
         ::anon_class_1_0_00000001::__invoke;
    return (Expression *)&pPVar1->item;
  }
  CompileMessageHelpers::createMessage<>(&local_a0,syntax,error,"Expected a value or endpoint");
  AST::Context::throwError(&(b->super_Statement).super_ASTObject.context,&local_a0,false);
}

Assistant:

AST::Expression& createBinaryOperator (const AST::Context& c, AST::Expression& a, AST::Expression& b, BinaryOp::Op op)
    {
        if (! AST::isPossiblyValue (a))  a.context.throwError (Errors::expectedValueOrEndpoint());
        if (! AST::isPossiblyValue (b))  b.context.throwError (Errors::expectedValueOrEndpoint());

        return allocate<AST::BinaryOperator> (c, a, b, op);
    }